

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::DebugOutStream::DebugOutStream(DebugOutStream *this)

{
  StreamBufImpl<Catch::OutputDebugWriter,_256UL> *this_00;
  streambuf *psVar1;
  IStream *in_RDI;
  
  IStream::IStream(in_RDI);
  in_RDI->_vptr_IStream = (_func_int **)&PTR__DebugOutStream_0021d7f0;
  this_00 = (StreamBufImpl<Catch::OutputDebugWriter,_256UL> *)operator_new(0x148);
  StreamBufImpl<Catch::OutputDebugWriter,_256UL>::StreamBufImpl(this_00);
  std::auto_ptr<Catch::StreamBufBase>::auto_ptr
            ((auto_ptr<Catch::StreamBufBase> *)(in_RDI + 1),&this_00->super_StreamBufBase);
  psVar1 = &std::auto_ptr<Catch::StreamBufBase>::get((auto_ptr<Catch::StreamBufBase> *)(in_RDI + 1))
            ->super_streambuf;
  std::ostream::ostream(in_RDI + 2,psVar1);
  return;
}

Assistant:

DebugOutStream::DebugOutStream()
    :   m_streamBuf( new StreamBufImpl<OutputDebugWriter>() ),
        m_os( m_streamBuf.get() )
    {}